

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

void emit_eobrun(huff_entropy_ptr entropy)

{
  size_t *psVar1;
  j_compress_ptr pjVar2;
  jpeg_error_mgr *pjVar3;
  JOCTET *pJVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  
  uVar6 = entropy->EOBRUN;
  if (uVar6 != 0) {
    uVar7 = 0;
    if (uVar6 != 1) {
      uVar7 = 0;
      do {
        uVar6 = (int)uVar6 >> 1;
        uVar7 = uVar7 + 1;
      } while (1 < uVar6);
    }
    if (0xe < uVar7) {
      pjVar2 = entropy->cinfo;
      pjVar3 = pjVar2->err;
      pjVar3->msg_code = 0x29;
      (*pjVar3->error_exit)((j_common_ptr)pjVar2);
    }
    emit_ac_symbol(entropy,entropy->ac_tbl_no,uVar7 << 4);
    if ((uVar7 != 0) && (entropy->gather_statistics == 0)) {
      iVar8 = uVar7 + (entropy->saved).put_bits;
      uVar10 = (ulong)(~(uint)(-1L << ((byte)uVar7 & 0x3f)) & entropy->EOBRUN) <<
               (0x18U - (char)iVar8 & 0x3f) | (entropy->saved).put_buffer;
      iVar9 = iVar8;
      if (7 < iVar8) {
        do {
          pJVar4 = entropy->next_output_byte;
          entropy->next_output_byte = pJVar4 + 1;
          *pJVar4 = (JOCTET)(uVar10 >> 0x10);
          psVar1 = &entropy->free_in_buffer;
          *psVar1 = *psVar1 - 1;
          if (*psVar1 == 0) {
            dump_buffer_e(entropy);
          }
          if ((~(uint)uVar10 & 0xff0000) == 0) {
            pJVar4 = entropy->next_output_byte;
            entropy->next_output_byte = pJVar4 + 1;
            *pJVar4 = '\0';
            psVar1 = &entropy->free_in_buffer;
            *psVar1 = *psVar1 - 1;
            if (*psVar1 == 0) {
              dump_buffer_e(entropy);
            }
          }
          uVar10 = uVar10 << 8;
          iVar8 = iVar9 + -8;
          bVar5 = 0xf < iVar9;
          iVar9 = iVar8;
        } while (bVar5);
      }
      (entropy->saved).put_buffer = uVar10;
      (entropy->saved).put_bits = iVar8;
    }
    entropy->EOBRUN = 0;
    emit_buffered_bits(entropy,entropy->bit_buffer,entropy->BE);
    entropy->BE = 0;
  }
  return;
}

Assistant:

LOCAL(void)
emit_eobrun (huff_entropy_ptr entropy)
{
  register int temp, nbits;

  if (entropy->EOBRUN > 0) {	/* if there is any pending EOBRUN */
    temp = entropy->EOBRUN;
    nbits = 0;
    while ((temp >>= 1))
      nbits++;
    /* safety check: shouldn't happen given limited correction-bit buffer */
    if (nbits > 14)
      ERREXIT(entropy->cinfo, JERR_HUFF_MISSING_CODE);

    emit_ac_symbol(entropy, entropy->ac_tbl_no, nbits << 4);
    if (nbits)
      emit_bits_e(entropy, entropy->EOBRUN, nbits);

    entropy->EOBRUN = 0;

    /* Emit any buffered correction bits */
    emit_buffered_bits(entropy, entropy->bit_buffer, entropy->BE);
    entropy->BE = 0;
  }
}